

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  bool bVar1;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int d_2;
  AssertionResult gtest_ar_1;
  int d_1;
  AssertionResult gtest_ar;
  int d;
  ParticleType particle;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  int line;
  double *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  Type type;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffe30;
  Message *in_stack_fffffffffffffe58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe60;
  AssertionResult local_178 [2];
  Vector3<double> local_158;
  Vector3<double> local_140;
  AssertionResult local_128;
  int local_114;
  Vector3<double> local_100;
  Vector3<double> local_e8;
  AssertionResult local_d0;
  int local_c0;
  uint local_bc;
  PositionType local_98;
  Vector3<double> local_80;
  AssertionResult local_68;
  int local_54;
  Particle<(pica::Dimension)3> local_50;
  
  pica::Particle<(pica::Dimension)3>::Particle(in_stack_fffffffffffffe00);
  local_54 = 0;
  while( true ) {
    if (2 < local_54) {
      local_c0 = 0;
      while( true ) {
        if (2 < local_c0) {
          local_114 = 0;
          while( true ) {
            type = (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20);
            if (2 < local_114) {
              pica::Particle<(pica::Dimension)3>::getFactor(&local_50);
              testing::internal::EqHelper<false>::Compare<double,double>
                        (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe08,(double *)in_stack_fffffffffffffe00);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe30);
                in_stack_fffffffffffffe00 =
                     (Particle<(pica::Dimension)3> *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x1f58a3);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffe30,type,
                           (char *)in_stack_fffffffffffffe20,
                           (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                           (char *)in_stack_fffffffffffffe10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)in_stack_fffffffffffffe60.ptr_,in_stack_fffffffffffffe58)
                ;
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffe00);
                testing::Message::~Message((Message *)0x1f58f1);
              }
              local_bc = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5972);
              if (local_bc == 0) {
                pica::Particle<(pica::Dimension)3>::getGamma(&local_50);
                testing::internal::EqHelper<false>::Compare<double,double>
                          (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,(double *)in_stack_fffffffffffffe00);
                line = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffffe58);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffe30);
                  testing::AssertionResult::failure_message((AssertionResult *)0x1f5a04);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffe30,type,
                             (char *)in_stack_fffffffffffffe20,line,
                             (char *)in_stack_fffffffffffffe10);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)in_stack_fffffffffffffe60.ptr_,
                             in_stack_fffffffffffffe58);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffe00);
                  testing::Message::~Message((Message *)0x1f5a50);
                }
                local_bc = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5ac8);
              }
              return;
            }
            pica::Vector3<double>::Vector3(&local_140);
            in_stack_fffffffffffffe10 =
                 (Particle<(pica::Dimension)3> *)
                 pica::Vector3<double>::operator[](&local_140,local_114);
            pica::Particle<(pica::Dimension)3>::getVelocity(in_stack_fffffffffffffe10);
            pica::Vector3<double>::operator[](&local_158,local_114);
            testing::internal::EqHelper<false>::Compare<double,double>
                      (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                       in_stack_fffffffffffffe08,(double *)in_stack_fffffffffffffe00);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe30);
              in_stack_fffffffffffffe08 =
                   (double *)testing::AssertionResult::failure_message((AssertionResult *)0x1f5703);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe30,
                         (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                         (char *)in_stack_fffffffffffffe20,
                         (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                         (char *)in_stack_fffffffffffffe10);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)in_stack_fffffffffffffe60.ptr_,in_stack_fffffffffffffe58);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe00);
              testing::Message::~Message((Message *)0x1f5760);
            }
            local_bc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f57e4);
            if (local_bc != 0) break;
            local_114 = local_114 + 1;
          }
          return;
        }
        pica::Vector3<double>::Vector3(&local_e8);
        in_stack_fffffffffffffe20 = pica::Vector3<double>::operator[](&local_e8,local_c0);
        pica::Particle<(pica::Dimension)3>::getMomentum(in_stack_fffffffffffffe30);
        pica::Vector3<double>::operator[](&local_100,local_c0);
        testing::internal::EqHelper<false>::Compare<double,double>
                  (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe08,(double *)in_stack_fffffffffffffe00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe30);
          in_stack_fffffffffffffe18 =
               testing::AssertionResult::failure_message((AssertionResult *)0x1f5527);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe30,
                     (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (char *)in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                     (char *)in_stack_fffffffffffffe10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe60.ptr_,in_stack_fffffffffffffe58);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
          testing::Message::~Message((Message *)0x1f5584);
        }
        local_bc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f5608);
        if (local_bc != 0) break;
        local_c0 = local_c0 + 1;
      }
      return;
    }
    pica::Vector3<double>::Vector3(&local_80);
    in_stack_fffffffffffffe30 =
         (Particle<(pica::Dimension)3> *)pica::Vector3<double>::operator[](&local_80,local_54);
    pica::Particle<(pica::Dimension)3>::getPosition(&local_98,&local_50);
    pica::Vector3<double>::operator[](&local_98,local_54);
    testing::internal::EqHelper<false>::Compare<double,double>
              (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
               ,(double *)in_stack_fffffffffffffe00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe28 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1f534b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe30,
                 (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),(char *)in_stack_fffffffffffffe20,
                 (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(char *)in_stack_fffffffffffffe10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffe60.ptr_,in_stack_fffffffffffffe58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
      testing::Message::~Message((Message *)0x1f53a8);
    }
    local_bc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f542c);
    if (local_bc != 0) break;
    local_54 = local_54 + 1;
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, DefaultConstructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle;
    ASSERT_EQ_VECTOR(PositionType(), particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getVelocity(), this->momentumDimension);
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
    ASSERT_EQ(static_cast<GammaType>(1.0), particle.getGamma());
}